

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_context * ggml_init(ggml_init_params params)

{
  uint uVar1;
  ggml_context *pgVar2;
  void *pvVar3;
  char *pcVar4;
  uint uVar5;
  int i;
  int line;
  long lVar6;
  anon_union_4_2_5fd15f10 fp32;
  ulong size;
  size_t sVar7;
  float fVar8;
  
  ggml_critical_section_start();
  if (ggml_init_is_first_call == '\0') {
    uVar1 = 0;
    uVar5 = 0;
    for (lVar6 = 0; lVar6 != 0x10000; lVar6 = lVar6 + 1) {
      fVar8 = (float)((uint)lVar6 & 0x7fff | 0x3f000000) + -0.5;
      if (0x7ffffff < uVar1) {
        fVar8 = (float)(uVar1 >> 4 | 0x70000000) * 1.92593e-34;
      }
      ggml_table_f32_f16[lVar6] = (float)(uVar5 & 0x80000000 | (uint)fVar8);
      uVar5 = uVar5 + 0x10000;
      uVar1 = uVar1 + 0x20000;
    }
    ggml_init_is_first_call = '\x01';
  }
  ggml_critical_section_end();
  pgVar2 = (ggml_context *)ggml_malloc(0x28);
  sVar7 = 0x10;
  if (params.mem_size != 0) {
    sVar7 = params.mem_size;
  }
  size = sVar7 + 0xf & 0xfffffffffffffff0;
  pvVar3 = params.mem_buffer;
  if (params.mem_buffer == (void *)0x0) {
    pvVar3 = ggml_aligned_malloc(size);
    sVar7 = size;
  }
  pgVar2->mem_size = sVar7;
  pgVar2->mem_buffer = pvVar3;
  pgVar2->mem_buffer_owned = params.mem_buffer == (void *)0x0;
  pgVar2->no_alloc = params.no_alloc;
  *(undefined4 *)((long)&pgVar2->objects_end + 4) = 0;
  *(undefined8 *)&pgVar2->n_objects = 0;
  *(undefined8 *)((long)&pgVar2->objects_begin + 4) = 0;
  if (pvVar3 == (void *)0x0) {
    pcVar4 = "ctx->mem_buffer != NULL";
    line = 0x5b3;
  }
  else {
    if (((ulong)pvVar3 & 0xf) == 0) {
      return pgVar2;
    }
    pcVar4 = "((uintptr_t) (ctx->mem_buffer))%GGML_MEM_ALIGN == 0";
    line = 0x5b5;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

struct ggml_context * ggml_init(struct ggml_init_params params) {
    static bool is_first_call = true;

    ggml_critical_section_start();

    if (is_first_call) {
        // initialize time system (required on Windows)
        ggml_time_init();

        for (int i = 0; i < (1 << 16); ++i) {
            union {
                uint16_t u16;
                ggml_fp16_t fp16;
            } u = {i};
            ggml_table_f32_f16[i] = GGML_COMPUTE_FP16_TO_FP32(u.fp16);
        }

        is_first_call = false;
    }

    ggml_critical_section_end();

    struct ggml_context * ctx = GGML_MALLOC(sizeof(struct ggml_context));

    // allow to call ggml_init with 0 size
    if (params.mem_size == 0) {
        params.mem_size = GGML_MEM_ALIGN;
    }

    const size_t mem_size = params.mem_buffer ? params.mem_size : GGML_PAD(params.mem_size, GGML_MEM_ALIGN);

    *ctx = (struct ggml_context) {
        /*.mem_size           =*/ mem_size,
        /*.mem_buffer         =*/ params.mem_buffer ? params.mem_buffer : ggml_aligned_malloc(mem_size),
        /*.mem_buffer_owned   =*/ params.mem_buffer ? false : true,
        /*.no_alloc           =*/ params.no_alloc,
        /*.n_objects          =*/ 0,
        /*.objects_begin      =*/ NULL,
        /*.objects_end        =*/ NULL,
    };

    GGML_ASSERT(ctx->mem_buffer != NULL);

    GGML_ASSERT_ALIGNED(ctx->mem_buffer);

    GGML_PRINT_DEBUG("%s: context initialized\n", __func__);

    return ctx;
}